

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void __thiscall
ON_SubDComponentBase::CopyBaseFrom
          (ON_SubDComponentBase *this,ON_SubDComponentBase *src,bool bCopySymmetrySetNext)

{
  long lVar1;
  undefined3 in_register_00000011;
  ON_SubDComponentBase *pOVar2;
  ON_SubDComponentBase *pOVar3;
  
  if (src == (ON_SubDComponentBase *)0x0) {
    src = &Unset;
  }
  pOVar2 = src;
  pOVar3 = this;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_subd_point1 = pOVar2->m_subd_point1;
    pOVar2 = (ON_SubDComponentBase *)&pOVar2->m_id;
    pOVar3 = (ON_SubDComponentBase *)&pOVar3->m_id;
  }
  this->m_subd_point1 = (ON_SubDVertex *)0x0;
  this->m_saved_points_flags = this->m_saved_points_flags & 0x43;
  if (CONCAT31(in_register_00000011,bCopySymmetrySetNext) != 0) {
    (this->m_symmetry_set_next).m_ptr = (src->m_symmetry_set_next).m_ptr;
  }
  return;
}

Assistant:

void ON_SubDComponentBase::CopyBaseFrom(
  const ON_SubDComponentBase* src,
  bool bCopySymmetrySetNext
  )
{
  if ( nullptr == src )
    src = &ON_SubDComponentBase::Unset;

  *this = *src;
  m_subd_point1 = nullptr;
  Internal_ClearSurfacePointFlag();
  if (bCopySymmetrySetNext)
    m_symmetry_set_next = src->m_symmetry_set_next;
}